

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pubkey.cc
# Opt level: O3

EVP_PKEY * X509_PUBKEY_get0(X509_PUBKEY *key)

{
  EVP_PKEY *pEVar1;
  
  if (key == (X509_PUBKEY *)0x0) {
    pEVar1 = (EVP_PKEY *)0x0;
  }
  else {
    pEVar1 = key->pkey;
    if (pEVar1 == (EVP_PKEY *)0x0) {
      pEVar1 = (EVP_PKEY *)0x0;
      ERR_put_error(0xb,0,0x7d,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x_pubkey.cc"
                    ,0x7a);
    }
  }
  return pEVar1;
}

Assistant:

EVP_PKEY *X509_PUBKEY_get0(const X509_PUBKEY *key) {
  if (key == NULL) {
    return NULL;
  }

  if (key->pkey == NULL) {
    OPENSSL_PUT_ERROR(X509, X509_R_PUBLIC_KEY_DECODE_ERROR);
    return NULL;
  }

  return key->pkey;
}